

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O3

int Cloud_SupportSize(CloudManager *dd,CloudNode *n)

{
  CloudNode *n_00;
  long lVar1;
  int *support;
  int iVar2;
  CloudNode *n_01;
  
  if ((dd->tUnique <= n) && (n < dd->tUnique + dd->nNodesAlloc)) {
    n_00 = (CloudNode *)calloc((long)dd->nVars,4);
    n_01 = n_00;
    cloudSupport((CloudManager *)((ulong)n & 0xfffffffffffffffe),n_00,support);
    cloudClearMark((CloudManager *)((ulong)n & 0xfffffffffffffffe),n_01);
    if ((long)dd->nVars < 1) {
      iVar2 = 0;
      if (n_00 == (CloudNode *)0x0) {
        return 0;
      }
    }
    else {
      lVar1 = 0;
      iVar2 = 0;
      do {
        iVar2 = iVar2 + (uint)((&n_00->s)[lVar1] == 1);
        lVar1 = lVar1 + 1;
      } while (dd->nVars != lVar1);
    }
    free(n_00);
    return iVar2;
  }
  __assert_fail("(n) >= dd->tUnique && (n) < dd->tUnique+dd->nNodesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/kit/cloud.c"
                ,0x296,"int Cloud_SupportSize(CloudManager *, CloudNode *)");
}

Assistant:

int Cloud_SupportSize( CloudManager * dd, CloudNode * n )
{
    int * support, i, count;

    CLOUD_ASSERT(n);

    // allocate and initialize support array for cloudSupport
    support = ABC_CALLOC( int, dd->nVars );

    // compute support and clean up markers
    cloudSupport( dd, Cloud_Regular(n), support );
    cloudClearMark( dd, Cloud_Regular(n) );

    // count support variables
    count = 0;
    for ( i = 0; i < dd->nVars; i++ )
    {
        if ( support[i] == 1 )
            count++;
    }

    ABC_FREE( support );
    return count;
}